

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

size_t __thiscall
compiler::CompilerAstWalker::indexOfConstant<long>
          (CompilerAstWalker *this,long t,vector<long,_std::allocator<long>_> *vec,
          unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *lookup)

{
  pointer plVar1;
  pointer plVar2;
  iterator iVar3;
  size_t sVar4;
  long local_28;
  long t_local;
  
  local_28 = t;
  iVar3 = std::
          _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&lookup->_M_h,&local_28);
  if (iVar3.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    plVar1 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    plVar2 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<long,_std::allocator<long>_>::push_back(vec,&local_28);
    sVar4 = (long)plVar1 - (long)plVar2 >> 3;
    std::
    _Hashtable<long,std::pair<long_const,unsigned_long>,std::allocator<std::pair<long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,unsigned_long>>
              ((_Hashtable<long,std::pair<long_const,unsigned_long>,std::allocator<std::pair<long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)lookup);
  }
  else {
    sVar4 = *(size_t *)
             ((long)iVar3.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>.
                    _M_cur + 0x10);
  }
  return sVar4;
}

Assistant:

std::size_t indexOfConstant(T t, std::vector<T> & vec, std::unordered_map<T, std::size_t> & lookup) noexcept {
    auto find = lookup.find(t);

    if (find == lookup.end()) {
      std::size_t vecLen = vec.size();
      vec.push_back(t);
      lookup.insert(std::make_pair(t, vecLen));
      return vecLen;

    } else {
      return find->second;
    }
  }